

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

ssize_t test_bson_json_read_cb_helper(void *string,uint8_t *buf,size_t len)

{
  void *local_48;
  size_t str_size;
  size_t len_local;
  uint8_t *buf_local;
  void *string_local;
  
  string_local = (void *)strlen((char *)string);
  if (string_local == (void *)0x0) {
    string_local = (void *)0x0;
  }
  else {
    local_48 = (void *)len;
    if (string_local < len) {
      local_48 = string_local;
    }
    memcpy(buf,string,(size_t)local_48);
  }
  return (ssize_t)string_local;
}

Assistant:

static ssize_t
test_bson_json_read_cb_helper (void *string, uint8_t *buf, size_t len)
{
   size_t str_size = strlen ((char *) string);
   if (str_size) {
      memcpy (buf, string, BSON_MIN (str_size, len));
      return str_size;
   } else {
      return 0;
   }
}